

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

KeyData * __thiscall
cfd::core::KeyData::DerivePrivkey
          (KeyData *__return_storage_ptr__,KeyData *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path,bool has_rebase_path)

{
  Privkey *this_00;
  bool bVar1;
  CfdException *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> join_path;
  ByteData fp;
  ExtPrivkey key;
  Privkey local_f0;
  Pubkey local_d0;
  ByteData local_b8;
  undefined1 local_a0 [40];
  pointer local_78;
  pointer local_60;
  pointer local_40;
  
  this_00 = &(this->extprivkey_).privkey_;
  bVar1 = Privkey::IsValid(this_00);
  if (bVar1) {
    ExtPrivkey::DerivePrivkey((ExtPrivkey *)local_a0,&this->extprivkey_,path);
    if (has_rebase_path) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      local_f0.is_compressed_ = (this->extprivkey_).privkey_.is_compressed_;
      local_f0._25_3_ = *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19;
      local_f0.net_type_ = (this->extprivkey_).privkey_.net_type_;
      Privkey::GeneratePubkey(&local_d0,&local_f0,true);
      Pubkey::GetFingerprint(&local_b8,&local_d0,4);
      if (local_d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      KeyData(__return_storage_ptr__,(ExtPrivkey *)local_a0,path,&local_b8);
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,&this->path_);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,
                 ((long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)local_f0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_f0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2));
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
      KeyData(__return_storage_ptr__,(ExtPrivkey *)local_a0,
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,&this->fingerprint_);
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_40 != (pointer)0x0) {
      operator_delete(local_40);
    }
    if (local_60 != (pointer)0x0) {
      operator_delete(local_60);
    }
    if (local_78 != (pointer)0x0) {
      operator_delete(local_78);
    }
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_);
    }
    return __return_storage_ptr__;
  }
  local_a0._0_8_ = "cfdcore_hdwallet.cpp";
  local_a0._8_4_ = 0x51c;
  local_a0._16_8_ = (long)"KeyData::DerivePrivkey" + 9;
  logger::log<>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,"Failed to invalid extPrivkey.");
  this_01 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a0._0_8_ = local_a0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"Failed to invalid extPrivkey.","");
  CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)local_a0);
  __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

KeyData KeyData::DerivePrivkey(
    std::vector<uint32_t> path, bool has_rebase_path) const {
  if (!extprivkey_.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to invalid extPrivkey.");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Failed to invalid extPrivkey.");
  }
  ExtPrivkey key = extprivkey_.DerivePrivkey(path);
  if (has_rebase_path) {
    auto fp = extprivkey_.GetPrivkey().GeneratePubkey().GetFingerprint();
    return KeyData(key, path, fp);
  } else {
    auto join_path = path_;
    join_path.reserve(join_path.size() + path.size());
    std::copy(path.begin(), path.end(), std::back_inserter(join_path));
    return KeyData(key, join_path, fingerprint_);
  }
}